

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O0

UnicodeString *
icu_63::RBBIRuleScanner::stripRules(UnicodeString *__return_storage_ptr__,UnicodeString *rules)

{
  bool bVar1;
  UBool UVar2;
  int32_t iVar3;
  UChar32 c;
  int32_t iStack_34;
  bool whiteSpace;
  UChar32 cp;
  int32_t idx;
  bool skippingSpaces;
  int32_t rulesLength;
  UnicodeString *rules_local;
  UnicodeString *strippedRules;
  
  UnicodeString::UnicodeString(__return_storage_ptr__);
  iVar3 = UnicodeString::length(rules);
  bVar1 = false;
  for (iStack_34 = 0; iStack_34 < iVar3; iStack_34 = UnicodeString::moveIndex32(rules,iStack_34,1))
  {
    c = UnicodeString::char32At(rules,iStack_34);
    UVar2 = u_hasBinaryProperty_63(c,UCHAR_PATTERN_WHITE_SPACE);
    if ((!bVar1) || (UVar2 == '\0')) {
      UnicodeString::append(__return_storage_ptr__,c);
      bVar1 = UVar2 != '\0';
    }
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString RBBIRuleScanner::stripRules(const UnicodeString &rules) {
    UnicodeString strippedRules;
    int32_t rulesLength = rules.length();
    bool skippingSpaces = false;

    for (int32_t idx=0; idx<rulesLength; idx = rules.moveIndex32(idx, 1)) {
        UChar32 cp = rules.char32At(idx);
        bool whiteSpace = u_hasBinaryProperty(cp, UCHAR_PATTERN_WHITE_SPACE);
        if (skippingSpaces && whiteSpace) {
            continue;
        }
        strippedRules.append(cp);
        skippingSpaces = whiteSpace;
    }
    return strippedRules;
}